

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  BYTE *pInLimit;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  int *ip_00;
  int *piVar10;
  seqStore_t *seqStorePtr;
  uint local_88;
  uint local_84;
  size_t local_80;
  size_t offsetFound;
  seqStore_t *local_68;
  int *local_60;
  ZSTD_matchState_t *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint *local_40;
  BYTE *local_38;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  local_38 = (ms->window).base + (ms->window).dictLimit;
  local_44 = *rep;
  local_48 = rep[1];
  ip_00 = (int *)((ulong)((int)src == (int)local_38) + (long)src);
  local_4c = (int)ip_00 - (int)local_38;
  local_88 = local_48;
  if (local_4c < local_48) {
    local_88 = 0;
  }
  uVar9 = (ulong)local_44;
  if (local_4c < local_44) {
    uVar9 = 0;
  }
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_68 = seqStore;
  local_58 = ms;
  local_40 = rep;
  do {
    local_84 = (uint)uVar9;
    lVar7 = -uVar9;
    while( true ) {
      if (local_60 <= ip_00) {
        uVar2 = 0;
        if (local_4c < local_48) {
          uVar2 = local_48;
        }
        if (local_4c < local_44) {
          uVar2 = local_44;
        }
        if (local_84 == 0) {
          local_84 = uVar2;
        }
        if (local_88 != 0) {
          uVar2 = local_88;
        }
        *local_40 = local_84;
        local_40[1] = uVar2;
        return (long)pInLimit - (long)src;
      }
      if (local_84 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        if (*(int *)((long)ip_00 + lVar7 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar3 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar7 + 5),pInLimit);
          uVar9 = sVar3 + 4;
        }
      }
      offsetFound = 999999999;
      sVar3 = ZSTD_BtFindBestMatch_selectMLS(local_58,(BYTE *)ip_00,pInLimit,&offsetFound);
      uVar4 = uVar9;
      if (uVar9 < sVar3) {
        uVar4 = sVar3;
      }
      if (3 < uVar4) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    sVar8 = offsetFound;
    if (sVar3 <= uVar9) {
      sVar8 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    if (uVar9 < sVar3) {
      ip = ip_00;
    }
LAB_003a1eae:
    do {
      piVar10 = ip_00;
      sVar3 = uVar4;
      local_80 = sVar8;
      piVar6 = ip;
      seqStorePtr = local_68;
      if (local_60 <= piVar10) break;
      ip = (int *)((long)piVar10 + 1);
      if (local_80 == 0) {
        local_80 = 0;
      }
      else if ((local_84 != 0) && (*ip == *(int *)((long)ip + lVar7))) {
        sVar8 = ZSTD_count((BYTE *)((long)piVar10 + 5),(BYTE *)((long)piVar10 + lVar7 + 5),pInLimit)
        ;
        if (sVar8 < 0xfffffffffffffffc) {
          uVar5 = (int)local_80 + 1;
          uVar2 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          if ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
            local_80 = 0;
            piVar6 = ip;
            sVar3 = sVar8 + 4;
          }
        }
      }
      offsetFound = 999999999;
      uVar4 = ZSTD_BtFindBestMatch_selectMLS(local_58,(BYTE *)ip,pInLimit,&offsetFound);
      if (3 < uVar4) {
        uVar5 = (int)local_80 + 1;
        uVar2 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar5 = (int)offsetFound + 1;
        iVar1 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        sVar8 = offsetFound;
        ip_00 = ip;
        if ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 4 + -0x1b) < (int)uVar4 * 4 - iVar1)
        goto LAB_003a1eae;
      }
      seqStorePtr = local_68;
      if (local_60 <= ip) break;
      ip = (int *)((long)piVar10 + 2);
      if (local_80 == 0) {
        local_80 = 0;
      }
      else if ((local_84 != 0) && (*ip == *(int *)((long)ip + lVar7))) {
        sVar8 = ZSTD_count((BYTE *)((long)piVar10 + 6),(BYTE *)((long)piVar10 + lVar7 + 6),pInLimit)
        ;
        if (sVar8 < 0xfffffffffffffffc) {
          uVar5 = (int)local_80 + 1;
          uVar2 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          if ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 4 + -0x1e) < (int)(sVar8 + 4) * 4) {
            local_80 = 0;
            piVar6 = ip;
            sVar3 = sVar8 + 4;
          }
        }
      }
      seqStorePtr = local_68;
      offsetFound = 999999999;
      uVar4 = ZSTD_BtFindBestMatch_selectMLS(local_58,(BYTE *)ip,pInLimit,&offsetFound);
      if (uVar4 < 4) break;
      uVar5 = (int)local_80 + 1;
      uVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar5 = (int)offsetFound + 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar8 = offsetFound;
      ip_00 = ip;
    } while ((int)((uVar2 ^ 0x1f) + (int)sVar3 * 4 + -0x18) < (int)uVar4 * 4 - iVar1);
    if (local_80 == 0) {
      local_80 = 0;
    }
    else {
      for (; ((src < piVar6 && (local_38 < (BYTE *)((long)piVar6 + (2 - local_80)))) &&
             (*(BYTE *)((long)piVar6 + -1) == *(BYTE *)((long)piVar6 + (1 - local_80))));
          piVar6 = (int *)((long)piVar6 + -1)) {
        sVar3 = sVar3 + 1;
      }
      local_88 = local_84;
      local_84 = (int)local_80 - 2;
    }
    ZSTD_storeSeq(seqStorePtr,(long)piVar6 - (long)src,src,(U32)local_80,sVar3 - 3);
    uVar2 = local_88;
    for (src = (void *)((long)piVar6 + sVar3);
        ((local_88 = uVar2, uVar9 = (ulong)local_84, ip_00 = (int *)src, local_88 != 0 &&
         (src <= local_60)) && (*src == *(int *)((long)src - (ulong)local_88)));
        src = (void *)((long)src + sVar3 + 4)) {
      sVar3 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_88)),
                         pInLimit);
      ZSTD_storeSeq(seqStorePtr,0,src,0,sVar3 + 1);
      uVar2 = local_84;
      local_84 = local_88;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 1, 2, ZSTD_noDict);
}